

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_cache_server.cpp
# Opt level: O3

void __thiscall cppcms::impl::tcp_cache_service::session::run(session *this)

{
  mutable_buffer tmp;
  intrusive_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_> local_58;
  intrusive_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_> local_50;
  __shared_ptr<cppcms::impl::tcp_cache_service::session,(__gnu_cxx::_Lock_policy)2> local_48 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  buffer_impl<char_*> local_38;
  
  local_38.size_ = 0;
  local_38.vec_.
  super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.vec_.
  super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.vec_.
  super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  booster::aio::buffer_impl<char_*>::add(&local_38,(char *)&this->hin_,0x28);
  std::__shared_ptr<cppcms::impl::tcp_cache_service::session,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<cppcms::impl::tcp_cache_service::session,void>
            (local_48,(__weak_ptr<cppcms::impl::tcp_cache_service::session,_(__gnu_cxx::_Lock_policy)2>
                       *)this);
  mfunc_to_io_handler<cppcms::impl::tcp_cache_service::session,std::shared_ptr<cppcms::impl::tcp_cache_service::session>>
            ((offset_in_session_to_subr)&local_58,
             (shared_ptr<cppcms::impl::tcp_cache_service::session> *)on_header_in);
  local_50.p_ = local_58.p_;
  if (local_58.p_ != (callable<void_(const_std::error_code_&,_unsigned_long)> *)0x0) {
    booster::atomic_counter::inc();
  }
  booster::aio::stream_socket::async_read((mutable_buffer *)&this->socket_,(callback *)&local_38);
  booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_>::
  ~intrusive_ptr(&local_50);
  booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_>::
  ~intrusive_ptr(&local_58);
  if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
  }
  if (local_38.vec_.
      super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.vec_.
                    super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void run()
	{
		socket_.async_read(io::buffer(&hin_,sizeof(hin_)),
				mfunc_to_io_handler(&session::on_header_in,shared_from_this()));
	}